

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtBox2dBox2dCollisionAlgorithm::processCollision
          (cbtBox2dBox2dCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtBox2dShape *polyA;
  cbtBox2dShape *polyB;
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    polyA = (cbtBox2dShape *)body0Wrap->m_shape;
    polyB = (cbtBox2dShape *)body1Wrap->m_shape;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    b2CollidePolygons(resultOut,polyA,body0Wrap->m_worldTransform,polyB,body1Wrap->m_worldTransform)
    ;
    if (this->m_ownManifold == true) {
      cbtManifoldResult::refreshContactPoints(resultOut);
      return;
    }
  }
  return;
}

Assistant:

void cbtBox2dBox2dCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	if (!m_manifoldPtr)
		return;

	const cbtBox2dShape* box0 = (const cbtBox2dShape*)body0Wrap->getCollisionShape();
	const cbtBox2dShape* box1 = (const cbtBox2dShape*)body1Wrap->getCollisionShape();

	resultOut->setPersistentManifold(m_manifoldPtr);

	b2CollidePolygons(resultOut, box0, body0Wrap->getWorldTransform(), box1, body1Wrap->getWorldTransform());

	//  refreshContactPoints is only necessary when using persistent contact points. otherwise all points are newly added
	if (m_ownManifold)
	{
		resultOut->refreshContactPoints();
	}
}